

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O3

void __thiscall fizplex::LP::add_row(LP *this,Row row)

{
  pointer *ppRVar1;
  iterator __position;
  
  __position._M_current =
       (this->rows).super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->rows).super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<fizplex::LP::Row,std::allocator<fizplex::LP::Row>>::
    _M_realloc_insert<fizplex::LP::Row_const&>
              ((vector<fizplex::LP::Row,std::allocator<fizplex::LP::Row>> *)&this->rows,__position,
               &row);
  }
  else {
    (__position._M_current)->upper = row.upper;
    (__position._M_current)->type = row.type;
    *(undefined4 *)&(__position._M_current)->field_0x4 = row._4_4_;
    (__position._M_current)->lower = row.lower;
    ppRVar1 = &(this->rows).super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  ColMatrix::add_row(&this->A);
  DVector::resize(&this->b,((long)(this->rows).
                                  super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->rows).
                                  super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
  set_b(this,((long)(this->rows).
                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->rows).
                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1);
  return;
}

Assistant:

void LP::add_row(Row row) {
  rows.push_back(row);
  A.add_row();
  b.resize(rows.size());
  set_b(rows.size() - 1);
}